

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void * rw::textureOpen(void *object,int32 offset,int32 size)

{
  TexDictionary *txd;
  undefined4 in_register_00000034;
  TexDictionary *texdict;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  textureModuleOffset = offset;
  LinkList::init((LinkList *)(engine + offset + 0x20),
                 (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,offset));
  LinkList::init((LinkList *)(engine + textureModuleOffset + 0x30),
                 (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,offset));
  txd = TexDictionary::create();
  *(TexDictionary **)(engine + textureModuleOffset) = txd;
  TexDictionary::setCurrent(txd);
  *(undefined4 *)(engine + 0x10 + (long)textureModuleOffset) = 1;
  *(undefined4 *)(engine + 0x14 + (long)textureModuleOffset) = 0;
  *(undefined4 *)(engine + 0x18 + (long)textureModuleOffset) = 0;
  *(undefined4 *)(engine + 0x1c + (long)textureModuleOffset) = 0;
  return object;
}

Assistant:

static void*
textureOpen(void *object, int32 offset, int32 size)
{
	TexDictionary *texdict;
	textureModuleOffset = offset;
	TEXTUREGLOBAL(texDicts).init();
	TEXTUREGLOBAL(textures).init();
	texdict = TexDictionary::create();
	TEXTUREGLOBAL(initialTexDict) = texdict;
	TexDictionary::setCurrent(texdict);
	TEXTUREGLOBAL(loadTextures) = 1;
	TEXTUREGLOBAL(makeDummies) = 0;
	TEXTUREGLOBAL(mipmapping) = 0;
	TEXTUREGLOBAL(autoMipmapping) = 0;
	return object;
}